

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::copyFrom(UnicodeString *this,UnicodeString *src,UBool fastCopy)

{
  ushort uVar1;
  ushort uVar2;
  UBool UVar3;
  int32_t capacity;
  char16_t *pcVar4;
  char16_t *src_00;
  
  if (this == src) {
    return this;
  }
  if ((undefined1  [56])((undefined1  [56])src->fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    setToBogus(this);
    return this;
  }
  releaseArray(this);
  uVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
  if (uVar1 < 0x20) {
    (this->fUnion).fStackFields.fLengthAndFlags = 2;
    return this;
  }
  (this->fUnion).fStackFields.fLengthAndFlags = uVar1;
  uVar2 = (src->fUnion).fStackFields.fLengthAndFlags;
  switch(uVar2 & 0x1f) {
  case 0:
    goto switchD_002dacb5_caseD_0;
  default:
    goto switchD_002dacb5_caseD_1;
  case 2:
    memcpy((void *)((long)&this->fUnion + 2),(void *)((long)&src->fUnion + 2),
           (long)(((int)(short)uVar1 >> 5) * 2));
    return this;
  case 4:
    LOCK();
    pcVar4 = (src->fUnion).fFields.fArray + -2;
    *(int *)pcVar4 = *(int *)pcVar4 + 1;
    UNLOCK();
    (this->fUnion).fFields.fArray = (src->fUnion).fFields.fArray;
    (this->fUnion).fFields.fCapacity = (src->fUnion).fFields.fCapacity;
    uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
joined_r0x002dad28:
    if (-1 < (short)uVar1) {
      return this;
    }
    (this->fUnion).fFields.fLength = (src->fUnion).fFields.fLength;
    return this;
  case 8:
    if (fastCopy != '\0') {
      (this->fUnion).fFields.fArray = (src->fUnion).fFields.fArray;
      (this->fUnion).fFields.fCapacity = (src->fUnion).fFields.fCapacity;
      goto joined_r0x002dad28;
    }
switchD_002dacb5_caseD_0:
    if ((short)uVar2 < 0) {
      capacity = (src->fUnion).fFields.fLength;
    }
    else {
      capacity = (int)(short)uVar2 >> 5;
    }
    UVar3 = allocate(this,capacity);
    if (UVar3 == '\0') {
switchD_002dacb5_caseD_1:
      (this->fUnion).fStackFields.fLengthAndFlags = 1;
      (this->fUnion).fFields.fArray = (char16_t *)0x0;
      (this->fUnion).fFields.fCapacity = 0;
    }
    else {
      if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (this->fUnion).fStackFields.fBuffer;
      }
      if (((src->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        src_00 = (src->fUnion).fFields.fArray;
      }
      else {
        src_00 = (src->fUnion).fStackFields.fBuffer;
      }
      u_memcpy_63(pcVar4,src_00,capacity);
      setLength(this,capacity);
    }
    return this;
  }
}

Assistant:

UnicodeString &
UnicodeString::copyFrom(const UnicodeString &src, UBool fastCopy) {
  // if assigning to ourselves, do nothing
  if(this == &src) {
    return *this;
  }

  // is the right side bogus?
  if(src.isBogus()) {
    setToBogus();
    return *this;
  }

  // delete the current contents
  releaseArray();

  if(src.isEmpty()) {
    // empty string - use the stack buffer
    setToEmpty();
    return *this;
  }

  // fLength>0 and not an "open" src.getBuffer(minCapacity)
  fUnion.fFields.fLengthAndFlags = src.fUnion.fFields.fLengthAndFlags;
  switch(src.fUnion.fFields.fLengthAndFlags & kAllStorageFlags) {
  case kShortString:
    // short string using the stack buffer, do the same
    uprv_memcpy(fUnion.fStackFields.fBuffer, src.fUnion.fStackFields.fBuffer,
                getShortLength() * U_SIZEOF_UCHAR);
    break;
  case kLongString:
    // src uses a refCounted string buffer, use that buffer with refCount
    // src is const, use a cast - we don't actually change it
    ((UnicodeString &)src).addRef();
    // copy all fields, share the reference-counted buffer
    fUnion.fFields.fArray = src.fUnion.fFields.fArray;
    fUnion.fFields.fCapacity = src.fUnion.fFields.fCapacity;
    if(!hasShortLength()) {
      fUnion.fFields.fLength = src.fUnion.fFields.fLength;
    }
    break;
  case kReadonlyAlias:
    if(fastCopy) {
      // src is a readonly alias, do the same
      // -> maintain the readonly alias as such
      fUnion.fFields.fArray = src.fUnion.fFields.fArray;
      fUnion.fFields.fCapacity = src.fUnion.fFields.fCapacity;
      if(!hasShortLength()) {
        fUnion.fFields.fLength = src.fUnion.fFields.fLength;
      }
      break;
    }
    // else if(!fastCopy) fall through to case kWritableAlias
    // -> allocate a new buffer and copy the contents
    U_FALLTHROUGH;
  case kWritableAlias: {
    // src is a writable alias; we make a copy of that instead
    int32_t srcLength = src.length();
    if(allocate(srcLength)) {
      u_memcpy(getArrayStart(), src.getArrayStart(), srcLength);
      setLength(srcLength);
      break;
    }
    // if there is not enough memory, then fall through to setting to bogus
    U_FALLTHROUGH;
  }
  default:
    // if src is bogus, set ourselves to bogus
    // do not call setToBogus() here because fArray and flags are not consistent here
    fUnion.fFields.fLengthAndFlags = kIsBogus;
    fUnion.fFields.fArray = 0;
    fUnion.fFields.fCapacity = 0;
    break;
  }

  return *this;
}